

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

void set_add_znode_hash(VecZNode *v,ZNode *z)

{
  uint uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ZNode **__s;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  size_t __size;
  ulong uVar8;
  ZNode **__ptr;
  
  uVar1 = v->n;
  uVar8 = CONCAT44(0,uVar1);
  if (uVar8 == 0) {
    v->i = 2;
    __ptr = (ZNode **)0x0;
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar8;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = z->pn;
    uVar6 = SUB168(auVar4 % auVar3,0);
    if (SUB164(auVar4 % auVar3,0) < uVar1) {
      uVar7 = 0;
      do {
        if (v->v[uVar6] == (ZNode *)0x0) {
          v->v[uVar6] = z;
          return;
        }
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
        if (uVar5 == uVar1) {
          uVar6 = 0;
        }
      } while (((uint)uVar6 < uVar1) && (bVar2 = uVar7 < 4, uVar7 = uVar7 + 1, bVar2));
    }
    __ptr = v->v;
    v->i = v->i + 2;
  }
  uVar1 = d_prime2[v->i];
  v->n = uVar1;
  __size = (ulong)uVar1 << 3;
  __s = (ZNode **)malloc(__size);
  v->v = __s;
  memset(__s,0,__size);
  if (__ptr != (ZNode **)0x0) {
    if (uVar8 != 0) {
      uVar6 = 0;
      do {
        if (__ptr[uVar6] != (ZNode *)0x0) {
          set_add_znode(v,__ptr[uVar6]);
        }
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
    free(__ptr);
  }
  set_add_znode(v,z);
  return;
}

Assistant:

static void set_add_znode_hash(VecZNode *v, ZNode *z) {
  uint i, j, n = v->n;
  VecZNode vv;
  vec_clear(&vv);
  if (n) {
    uint h = ((uintptr_t)z->pn) % n;
    for (i = h, j = 0; i < v->n && j < SET_MAX_SEQUENTIAL; i = ((i + 1) % n), j++) {
      if (!v->v[i]) {
        v->v[i] = z;
        return;
      }
    }
  }
  if (!n) {
    vv.v = NULL;
    v->i = INITIAL_SET_SIZE_INDEX;
  } else {
    vv.v = (void *)v->v;
    vv.n = v->n;
    v->i = v->i + 2;
  }
  v->n = d_prime2[v->i];
  v->v = MALLOC(v->n * sizeof(void *));
  memset(v->v, 0, v->n * sizeof(void *));
  if (vv.v) {
    set_union_znode(v, &vv);
    FREE(vv.v);
  }
  set_add_znode(v, z);
}